

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void wasm::RemoveUnusedBrs::visitAny(RemoveUnusedBrs *self,Expression **currp)

{
  size_t *this;
  Flows *this_00;
  Id IVar1;
  Switch *curr;
  size_t sVar2;
  Expression *pEVar3;
  pointer pppEVar4;
  pointer pvVar5;
  If *pIVar6;
  Break *pBVar7;
  Expression **ppEVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  Nop *output;
  MixedArena *pMVar12;
  Expression **ppEVar13;
  uint uVar14;
  MixedArena *index;
  Expression *local_58;
  Expression **flow;
  type ifTrueFlows;
  Expression **currp_local;
  
  curr = (Switch *)*currp;
  this_00 = &self->flows;
  IVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression._id;
  ifTrueFlows.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)currp;
  switch(IVar1) {
  case BlockId:
    sVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
    if (sVar2 != 0) {
      uVar10 = (ulong)((long)(self->flows).
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(self->flows).
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
      iVar9 = 0;
      for (uVar11 = 0; (uVar10 & 0xffffffff) != uVar11; uVar11 = uVar11 + 1) {
        pppEVar4 = (this_00->
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar8 = pppEVar4[uVar11];
        pEVar3 = *ppEVar8;
        if ((pEVar3->_id == BreakId) && (pEVar3[1].type.id == sVar2)) {
          if (*(Expression **)(pEVar3 + 2) == (Expression *)0x0) {
            pEVar3->_id = NopId;
            (pEVar3->type).id = 0;
          }
          else {
            *ppEVar8 = *(Expression **)(pEVar3 + 2);
          }
          iVar9 = iVar9 + 1;
          self->anotherCycle = true;
        }
        else if (iVar9 == 0) {
          iVar9 = 0;
        }
        else {
          pppEVar4[(uint)((int)uVar11 - iVar9)] = ppEVar8;
        }
      }
      if (iVar9 != 0) {
        std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::resize
                  (this_00,(ulong)(uint)((int)uVar10 - iVar9));
      }
    }
    this = &(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
            allocatedElements;
    while ((curr->targets).allocator != (MixedArena *)0x0) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           this);
      pMVar12 = (curr->targets).allocator;
      if ((*ppEVar8)->_id != NopId) goto LAB_00b54f95;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this,
                 (size_t)((long)&pMVar12[-1].next._M_b._M_p + 7));
      self->anotherCycle = true;
    }
    pMVar12 = (MixedArena *)0x0;
LAB_00b54f95:
    for (uVar14 = 0; index = (MixedArena *)(ulong)uVar14, index < pMVar12; uVar14 = uVar14 + 1) {
      if (((MixedArena *)((long)&pMVar12[-1].next._M_b._M_p + 7) != index) &&
         (ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)this,(size_t)index), ((*ppEVar8)->type).id == 1))
      goto LAB_00b5506b;
    }
    break;
  case IfId:
    pIVar6 = Expression::cast<wasm::If>((Expression *)curr);
    if ((pIVar6->condition->type).id != 1) {
      if (pIVar6->ifFalse != (Expression *)0x0) {
        pvVar5 = (self->ifStack).
                 super__Vector_base<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar5 != (self->ifStack).
                      super__Vector_base<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          ppEVar8 = (Expression **)
                    pvVar5[-1].
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppEVar13 = (Expression **)
                     pvVar5[-1].
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          ifTrueFlows.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               pvVar5[-1].
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
          pvVar5[-1].super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pvVar5[-1].super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pvVar5[-1].super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          flow = ppEVar8;
          ifTrueFlows.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar13;
          std::
          vector<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>,_std::allocator<std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>
          ::pop_back(&self->ifStack);
          if (((pIVar6->ifTrue->type).id == 0) || ((pIVar6->ifFalse->type).id == 0)) {
            removeValueFlow(self,(Flows *)&flow);
            stopValueFlow(self);
            ppEVar8 = flow;
            ppEVar13 = (Expression **)
                       ifTrueFlows.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          }
          for (; ppEVar8 != ppEVar13; ppEVar8 = ppEVar8 + 1) {
            local_58 = *ppEVar8;
            std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
                      (this_00,(value_type *)&local_58);
          }
          std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
          ~_Vector_base((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        &flow);
          return;
        }
        __assert_fail("self->ifStack.size() > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                      ,0xc4,
                      "static void wasm::RemoveUnusedBrs::visitAny(RemoveUnusedBrs *, Expression **)"
                     );
      }
LAB_00b5506b:
      stopValueFlow(self);
      return;
    }
    goto LAB_00b54ed7;
  case LoopId:
    break;
  case BreakId:
    pppEVar4 = (self->flows).
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish != pppEVar4) {
      (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppEVar4;
    }
    pBVar7 = Expression::cast<wasm::Break>((Expression *)curr);
    if (pBVar7->condition != (Expression *)0x0) goto LAB_00b5506b;
LAB_00b54f33:
    std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
              (this_00,(value_type *)
                       &ifTrueFlows.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case SwitchId:
    pppEVar4 = (self->flows).
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish != pppEVar4) {
      (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppEVar4;
    }
    optimizeSwitch(self,curr);
    return;
  default:
    if (IVar1 == ReturnId) {
      pppEVar4 = (self->flows).
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((self->flows).
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_finish != pppEVar4) {
        (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish = pppEVar4;
      }
      goto LAB_00b54f33;
    }
    if (IVar1 == NopId) goto LAB_00b5506b;
    if (IVar1 == TryTableId) {
      return;
    }
LAB_00b54ed7:
    pppEVar4 = (self->flows).
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_finish != pppEVar4) {
      (self->flows).super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_finish = pppEVar4;
    }
  }
  return;
}

Assistant:

static void visitAny(RemoveUnusedBrs* self, Expression** currp) {
    auto* curr = *currp;
    auto& flows = self->flows;

    if (curr->is<Break>()) {
      flows.clear();
      auto* br = curr->cast<Break>();
      if (!br->condition) { // TODO: optimize?
        // a break, let's see where it flows to
        flows.push_back(currp);
      } else {
        self->stopValueFlow();
      }
    } else if (curr->is<Return>()) {
      flows.clear();
      flows.push_back(currp);
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (iff->condition->type == Type::unreachable) {
        // avoid trying to optimize this, we never reach it anyhow
        self->stopFlow();
        return;
      }
      if (iff->ifFalse) {
        assert(self->ifStack.size() > 0);
        auto ifTrueFlows = std::move(self->ifStack.back());
        self->ifStack.pop_back();
        // we can flow values out in most cases, except if one arm
        // has the none type - we will update the types later, but
        // there is no way to emit a proper type for one arm being
        // none and the other flowing a value; and there is no way
        // to flow a value from a none.
        if (iff->ifTrue->type == Type::none ||
            iff->ifFalse->type == Type::none) {
          self->removeValueFlow(ifTrueFlows);
          self->stopValueFlow();
        }
        for (auto* flow : ifTrueFlows) {
          flows.push_back(flow);
        }
      } else {
        // if without else stops the flow of values
        self->stopValueFlow();
      }
    } else if (auto* block = curr->dynCast<Block>()) {
      // any breaks flowing to here are unnecessary, as we get here anyhow
      auto name = block->name;
      auto& list = block->list;
      if (name.is()) {
        Index size = flows.size();
        Index skip = 0;
        for (Index i = 0; i < size; i++) {
          auto* flow = (*flows[i])->dynCast<Break>();
          if (flow && flow->name == name) {
            if (!flow->value) {
              // br => nop
              ExpressionManipulator::nop<Break>(flow);
            } else {
              // br with value => value
              *flows[i] = flow->value;
            }
            skip++;
            self->anotherCycle = true;
          } else if (skip > 0) {
            flows[i - skip] = flows[i];
          }
        }
        if (skip > 0) {
          flows.resize(size - skip);
        }
      }
      // Drop a nop at the end of a block, which prevents a value flowing. Note
      // that this is worth doing regardless of whether we have a name on this
      // block or not (which the if right above us checks) - such a nop is
      // always unneeded and can limit later optimizations.
      while (list.size() > 0 && list.back()->is<Nop>()) {
        list.resize(list.size() - 1);
        self->anotherCycle = true;
      }
      // A value flowing is only valid if it is a value that the block actually
      // flows out. If it is never reached, it does not flow out, and may be
      // invalid to represent as such.
      auto size = list.size();
      for (Index i = 0; i < size; i++) {
        if (i != size - 1 && list[i]->type == Type::unreachable) {
          // No value flows out of this block.
          self->stopValueFlow();
          break;
        }
      }
    } else if (curr->is<Nop>()) {
      // Ignore (could be result of a previous cycle).
      self->stopValueFlow();
    } else if (curr->is<Loop>() || curr->is<TryTable>()) {
      // Do nothing - it's ok for values to flow out.
      // TODO: Legacy Try as well?
    } else if (auto* sw = curr->dynCast<Switch>()) {
      self->stopFlow();
      self->optimizeSwitch(sw);
    } else {
      // Anything else stops the flow.
      self->stopFlow();
    }
  }